

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

QStringView __thiscall
QXmlStreamAttributes::value(QXmlStreamAttributes *this,QAnyStringView qualifiedName)

{
  long lVar1;
  QXmlStreamAttribute *pQVar2;
  bool bVar3;
  qsizetype qVar4;
  storage_type_conflict *psVar5;
  long lVar6;
  QStringView QVar7;
  QAnyStringView lhs;
  
  lVar1 = (this->super_QList<QXmlStreamAttribute>).d.size;
  if (lVar1 == 0) {
    return (QStringView)ZEXT816(0);
  }
  pQVar2 = (this->super_QList<QXmlStreamAttribute>).d.ptr;
  lVar6 = 0;
  do {
    lhs.m_size = *(ulong *)((long)&(pQVar2->m_qualifiedName).m_string.size + lVar6) |
                 0x8000000000000000;
    lhs.field_0.m_data =
         ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)
         ((long)&(pQVar2->m_qualifiedName).m_string.ptr + lVar6))->m_data;
    bVar3 = QAnyStringView::equal(lhs,qualifiedName);
    if (bVar3) {
      psVar5 = *(storage_type_conflict **)((long)&(pQVar2->m_value).m_string.ptr + lVar6);
      qVar4 = *(qsizetype *)((long)&(pQVar2->m_value).m_string.size + lVar6);
      goto LAB_003a2922;
    }
    lVar6 = lVar6 + 0x68;
  } while (lVar1 * 0x68 - lVar6 != 0);
  psVar5 = (storage_type_conflict *)0x0;
  qVar4 = 0;
LAB_003a2922:
  QVar7.m_data = psVar5;
  QVar7.m_size = qVar4;
  return QVar7;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }